

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StatementList * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*const,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<const_slang::ast::Statement_*const,_18446744073709551615UL> *args,SourceRange *args_1
          )

{
  pointer ppSVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  StatementList *pSVar5;
  
  pSVar5 = (StatementList *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StatementList *)this->endPtr < pSVar5 + 1) {
    pSVar5 = (StatementList *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pSVar5 + 1);
  }
  ppSVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  SVar3 = args_1->startLoc;
  SVar4 = args_1->endLoc;
  (pSVar5->super_Statement).kind = List;
  (pSVar5->super_Statement).syntax = (StatementSyntax *)0x0;
  (pSVar5->super_Statement).sourceRange.startLoc = SVar3;
  (pSVar5->super_Statement).sourceRange.endLoc = SVar4;
  (pSVar5->list)._M_ptr = ppSVar1;
  (pSVar5->list)._M_extent._M_extent_value = sVar2;
  return pSVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }